

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

result_type __thiscall
boost::function1<void,_boost::unit_test::basic_cstring<const_char>_>::operator()
          (function1<void,_boost::unit_test::basic_cstring<const_char>_> *this,
          basic_cstring<const_char> *a0)

{
  bool bVar1;
  vtable_type *pvVar2;
  basic_cstring<const_char> *s;
  iterator extraout_RDX;
  type *in_RSI;
  function_base *in_RDI;
  basic_cstring<const_char> bVar3;
  bad_function_call *in_stack_ffffffffffffffa0;
  invoker_type p_Var4;
  basic_cstring<const_char> local_40 [2];
  bad_function_call *in_stack_ffffffffffffffe0;
  
  bVar1 = function_base::empty(in_RDI);
  if (!bVar1) {
    pvVar2 = get_vtable((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)in_RDI);
    p_Var4 = pvVar2->invoker;
    s = forward<boost::unit_test::basic_cstring<char_const>>(in_RSI);
    unit_test::basic_cstring<const_char>::basic_cstring(local_40,s);
    bVar3.m_end = extraout_RDX;
    bVar3.m_begin = (iterator)local_40;
    (*p_Var4)(&in_RDI->functor,bVar3);
    return;
  }
  bad_function_call::bad_function_call(in_stack_ffffffffffffffa0);
  throw_exception<boost::bad_function_call>(in_stack_ffffffffffffffe0);
}

Assistant:

result_type operator()(BOOST_FUNCTION_PARMS) const
    {
      if (this->empty())
        boost::throw_exception(bad_function_call());

      return get_vtable()->invoker
               (this->functor BOOST_FUNCTION_COMMA BOOST_FUNCTION_ARGS);
    }